

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_pipeline.cpp
# Opt level: O2

int main(void)

{
  Node *this;
  Node *v;
  FlowBuilder this_00;
  uint uVar1;
  Executor *pEVar2;
  long lVar3;
  bool bVar4;
  allocator<char> local_3d1;
  Future<void> local_3d0;
  FlowBuilder local_3b0;
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  pipes;
  anon_class_8_1_4eff857e pipe_callable;
  shared_ptr<tf::WorkerInterface> local_388;
  Taskflow taskflow;
  array<unsigned_long,_4UL> buffer;
  Executor executor;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  pl;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&executor,"pipeline",(allocator<char> *)&pl);
  tf::Taskflow::Taskflow(&taskflow,(string *)&executor);
  std::__cxx11::string::~string((string *)&executor);
  uVar1 = std::thread::hardware_concurrency();
  local_388.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_388.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)uVar1,&local_388);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_388.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pipe_callable.buffer = &buffer;
  pipes.
  super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pipes.
  super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipes.
  super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 3;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    pl._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
    std::
    vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
    ::emplace_back<tf::PipeType,main::__2&>
              ((vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
                *)&pipes,(PipeType *)&pl,&pipe_callable);
  }
  tf::
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  ::ScalablePipeline(&pl,4,(__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
                            )pipes.
                             super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
                      )pipes.
                       super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  this_00 = taskflow.super_FlowBuilder;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_3d0.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_3d0.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_3d0.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_3d0.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_3d0.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_3d0.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_3d0.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_3d0.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_3d0.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/scalable_pipeline.cpp:84:36)>
       ::_M_invoke;
  *(code **)&local_3d0.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/scalable_pipeline.cpp:84:36)>
       ::_M_manager;
  *(undefined1 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)this_00._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3d0);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3d0);
  this = ((this_00._graph)->
         super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         ).
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"starting pipeline",(allocator<char> *)&local_3b0);
  std::__cxx11::string::_M_assign((string *)&this->_name);
  std::__cxx11::string::~string((string *)&local_3d0);
  tf::FlowBuilder::
  composed_of<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void(tf::Pipeflow&)>>*,std::vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>>>>
            (&local_3b0,
             (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
              *)&taskflow);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"pipeline",&local_3d1);
  std::__cxx11::string::_M_assign
            ((string *)
             &((local_3b0._graph)->
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ).
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_3d0);
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_3d0.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_3d0.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_3d0.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_3d0.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_3d0.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_3d0.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_3d0.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_3d0.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_3d0.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/scalable_pipeline.cpp:88:36)>
       ::_M_invoke;
  *(code **)&local_3d0.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/scalable_pipeline.cpp:88:36)>
       ::_M_manager;
  *(undefined1 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_3d0.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)taskflow.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3d0);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3d0);
  v = ((taskflow.super_FlowBuilder._graph)->
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ).
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"pipeline stopped",(allocator<char> *)&local_3b0);
  std::__cxx11::string::_M_assign((string *)&v->_name);
  std::__cxx11::string::~string((string *)&local_3d0);
  tf::Node::_precede(this,(Node *)local_3b0._graph);
  tf::Node::_precede((Node *)local_3b0._graph,v);
  tf::Taskflow::dump(&taskflow,(ostream *)&std::cout);
  pEVar2 = &executor;
  tf::Executor::run(&local_3d0,pEVar2,&taskflow);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_3d0,pEVar2);
  tf::Future<void>::~Future(&local_3d0);
  lVar3 = 2;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    local_3d0.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_3d0.super_future<void>.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,2);
    std::
    vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
    ::emplace_back<tf::PipeType,main::__2&>
              ((vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
                *)&pipes,(PipeType *)&local_3d0,&pipe_callable);
  }
  tf::
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  ::reset(&pl,(__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
               )pipes.
                super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
          (__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
           )pipes.
            super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish);
  pEVar2 = &executor;
  tf::Executor::run(&local_3d0,pEVar2,&taskflow);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_3d0,pEVar2);
  tf::Future<void>::~Future(&local_3d0);
  tf::
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  ::~ScalablePipeline(&pl);
  std::
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ::~vector(&pipes);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return 0;
}

Assistant:

int main() {

  tf::Taskflow taskflow("pipeline");
  tf::Executor executor;

  const size_t num_lines = 4;

  // create data storage
  std::array<size_t, num_lines> buffer;

  // define the pipe callable
  auto pipe_callable = [&buffer] (tf::Pipeflow& pf) mutable {
    switch(pf.pipe()) {
      // first stage generates only 5 scheduling tokens and saves the
      // token number into the buffer.
      case 0: {
        if(pf.token() == 5) {
          pf.stop();
        }
        else {
          printf("stage 1: input token = %zu\n", pf.token());
          buffer[pf.line()] = pf.token();
        }
        return;
      }
      break;

      // other stages propagate the previous result to this pipe and
      // increment it by one
      default: {
        printf(
          "stage %zu: input buffer[%zu] = %zu\n", pf.pipe(), pf.line(), buffer[pf.line()]
        );
        buffer[pf.line()] = buffer[pf.line()] + 1;
      }
      break;
    }
  };

  // create a vector of three pipes
  std::vector< tf::Pipe<std::function<void(tf::Pipeflow&)>> > pipes;

  for(size_t i=0; i<3; i++) {
    pipes.emplace_back(tf::PipeType::SERIAL, pipe_callable);
  }

  // create a pipeline of four parallel lines using the given vector of pipes
  tf::ScalablePipeline<decltype(pipes)::iterator> pl(num_lines, pipes.begin(), pipes.end());

  // build the pipeline graph using composition
  tf::Task init = taskflow.emplace([](){ std::cout << "ready\n"; })
                          .name("starting pipeline");
  tf::Task task = taskflow.composed_of(pl)
                          .name("pipeline");
  tf::Task stop = taskflow.emplace([](){ std::cout << "stopped\n"; })
                          .name("pipeline stopped");

  // create task dependency
  init.precede(task);
  task.precede(stop);

  // dump the pipeline graph structure (with composition)
  taskflow.dump(std::cout);

  // run the pipeline
  executor.run(taskflow).wait();

  // reset the pipeline to a new range of five pipes and starts from
  // the initial state (i.e., token counts from zero)
  for(size_t i=0; i<2; i++) {
    pipes.emplace_back(tf::PipeType::SERIAL, pipe_callable);
  }
  pl.reset(pipes.begin(), pipes.end());

  executor.run(taskflow).wait();

  return 0;
}